

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::deinit
          (TessellationShaderTCTEgl_PatchVerticesIn *this)

{
  pointer p_Var1;
  int iVar2;
  undefined4 extraout_var;
  pointer p_Var4;
  long lVar3;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar3 + 0x40))(0x8c8e,0);
    (**(code **)(lVar3 + 0x48))(0x8c8e,0,0);
    (**(code **)(lVar3 + 0x4e8))(0x8c89);
    (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)(lVar3 + 0xd8))(0);
    if (this->m_bo_id != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    for (p_Var4 = (this->m_tests).
                  super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var1 = (this->m_tests).
                 super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish, p_Var4 != p_Var1; p_Var4 = p_Var4 + 1)
    {
      deinitTestDescriptor(this,p_Var4);
    }
    p_Var4 = (this->m_tests).
             super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var1 != p_Var4) {
      (this->m_tests).
      super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish = p_Var4;
    }
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_PatchVerticesIn::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Reset GL_PATCH_VERTICES_EXT to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release all objects we might've created */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	for (_tests::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		deinitTestDescriptor(&*it);
	}
	m_tests.clear();
}